

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O2

void lj_func_closeuv(lua_State *L,TValue *level)

{
  global_State *g;
  GCupval *uv;
  TValue TVar1;
  
  g = (global_State *)(L->glref).ptr64;
  while ((uv = (GCupval *)(L->openupval).gcptr64, uv != (GCupval *)0x0 &&
         (level <= (TValue *)(uv->v).ptr64))) {
    (L->openupval).gcptr64 = (uv->nextgc).gcptr64;
    if ((~(g->gc).currentwhite & uv->marked & 3) == 0) {
      TVar1 = (TValue)(uv->field_5).tv;
      ((TValue *)((uv->field_5).field_1.next.gcptr64 + 0x10))->u64 = (uint64_t)TVar1;
      *(uint64_t *)(TVar1.u64 + 0x18) = (uv->field_5).field_1.next.gcptr64;
      lj_gc_closeuv(g,uv);
    }
    else {
      lj_func_freeuv(g,uv);
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_func_closeuv(lua_State *L, TValue *level)
{
  GCupval *uv;
  global_State *g = G(L);
  while (gcref(L->openupval) != NULL &&
	 uvval((uv = gco2uv(gcref(L->openupval)))) >= level) {
    GCobj *o = obj2gco(uv);
    lj_assertG(!isblack(o), "bad black upvalue");
    lj_assertG(!uv->closed && uvval(uv) != &uv->tv, "closed upvalue in chain");
    setgcrefr(L->openupval, uv->nextgc);  /* No longer in open list. */
    if (isdead(g, o)) {
      lj_func_freeuv(g, uv);
    } else {
      unlinkuv(g, uv);
      lj_gc_closeuv(g, uv);
    }
  }
}